

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

mcu8str * mctools_dirname(mcu8str *__return_storage_ptr__,mcu8str *pathraw)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *__src;
  mcu8str_size_t prealloc_size;
  mcu8str path;
  mcu8str local_40;
  
  pcVar5 = pathraw->c_str;
  uVar1 = pathraw->size;
  local_40.buflen = uVar1 + 1;
  local_40.owns_memory = 0;
  local_40.c_str = pcVar5;
  local_40.size = uVar1;
  iVar4 = mctools_impl_has_winnamespace(pathraw);
  if (iVar4 != 0) {
    local_40.c_str = pcVar5 + 4;
    local_40.size = uVar1 - 4;
  }
  cVar3 = mctools_drive_letter(&local_40);
  uVar6 = (ulong)((uint)(cVar3 != '\0') * 2);
  if (uVar6 != local_40.size) {
    __src = local_40.c_str + uVar6;
    pcVar5 = local_40.c_str + local_40.size;
    do {
      pcVar5 = pcVar5 + -1;
      pcVar2 = pcVar5;
      if ((pcVar5 <= __src) || (*pcVar5 == '\\')) break;
    } while (*pcVar5 != '/');
    for (; (__src < pcVar2 && ((pcVar2[-1] == '\\' || (pcVar5 = pcVar2, pcVar2[-1] == '/'))));
        pcVar2 = pcVar2 + -1) {
      pcVar5 = __src;
    }
    if ((pcVar5 == __src) && ((*pcVar5 == '\\' || (*pcVar5 == '/')))) {
      pcVar5 = pcVar5 + 1;
    }
    prealloc_size = (long)pcVar5 - (long)__src;
    if ((prealloc_size == 1) && (*__src == '.')) {
      if (cVar3 == '\0') {
LAB_001039da:
        mcu8str_create_from_cstr(__return_storage_ptr__,".");
        return __return_storage_ptr__;
      }
      goto LAB_001038dc;
    }
    if (pcVar5 != __src) {
      if (cVar3 == '\0') {
        mcu8str_create(__return_storage_ptr__,prealloc_size);
        pcVar5 = __return_storage_ptr__->c_str;
        memcpy(pcVar5,__src,prealloc_size);
        pcVar5[prealloc_size] = '\0';
      }
      else {
        mcu8str_create(__return_storage_ptr__,prealloc_size + 2);
        pcVar5 = __return_storage_ptr__->c_str;
        *pcVar5 = cVar3;
        pcVar5[1] = ':';
        memcpy(pcVar5 + 2,__src,prealloc_size);
        pcVar5[prealloc_size + 2] = '\0';
        prealloc_size = (mcu8str_size_t)((int)prealloc_size + 2);
      }
      __return_storage_ptr__->size = (uint)prealloc_size;
      mctools_pathseps_platform(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    if ((cVar3 == '\0') && (*local_40.c_str == '.')) goto LAB_001039da;
  }
  if (cVar3 == '\0') {
    __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
    __return_storage_ptr__->size = 0;
    __return_storage_ptr__->buflen = 0;
    __return_storage_ptr__->owns_memory = 0;
    return __return_storage_ptr__;
  }
LAB_001038dc:
  mcu8str_create_from_cstr(__return_storage_ptr__,"::");
  *__return_storage_ptr__->c_str = cVar3;
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_dirname( const mcu8str* pathraw )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(pathraw);
    char drive_letter = mctools_drive_letter( &path );
    const char * itB = path.c_str;
    const char * itE = path.c_str + path.size;
    if ( drive_letter )
      itB += 2;//ignore drive letter while analysing

    if ( itB == itE ) {
      //empty:
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }

    //Find last path sep, skipping consecutive separatorss:
    const char * it0 = itB;
    //const char * itB = ( drive_letter ? it0 + 2 : it0 );
    const char * it = (itE-1);//start at last

    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    //it is now at the last path sep:
    while ( it > itB && ( *(it-1)=='/' || *(it-1)=='\\' ) )
      --it;

    //If this turned a path starting with a path sep into an empty path, add
    //back a single slash (so that dirname("/")="/" and not ""):
    if ( it == itB && ( *it == '/' || *it == '\\' ) )
      ++it;

    //Apart from a potential drive_letter, the string at [it0,it) is now the
    //result:
    mcu8str_size_t ressize = (mcu8str_size_t)(it-it0);

    if ( ressize == 1 && *it0 == '.' ) {
      //special case, "." or "D:."
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_from_cstr(".");
      }
    }

    if ( ressize == 0 ) {
      if ( path.c_str[0] == '.' && !drive_letter )
        return mcu8str_create_from_cstr(".");
      if ( drive_letter ) {
        mcu8str res = mcu8str_create_from_cstr("::");
        res.c_str[0] = drive_letter;
        return res;
      } else {
        return mcu8str_create_empty();
      }
    }
    if ( drive_letter ) {
      mcu8str res = mcu8str_create( ressize + 2 );
      res.c_str[0] = drive_letter;
      res.c_str[1] = ':';
      STDNS memcpy( res.c_str + 2, it0, ressize );
      res.c_str[ressize+2] = '\0';
      res.size = (unsigned)ressize+2;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    } else {
      mcu8str res = mcu8str_create( ressize );
      STDNS memcpy( res.c_str, it0, ressize );
      res.c_str[ressize] = '\0';
      res.size = (unsigned)ressize;//cast ok, checked by mcu8str_create
      mctools_pathseps_platform(&res);
      return res;
    }
  }